

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall spvtools::val::ValidationState_t::IsPointerType(ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  Instruction *pIVar2;
  
  pIVar2 = FindDef(this,id);
  if (pIVar2 != (Instruction *)0x0) {
    uVar1 = (pIVar2->inst_).opcode;
    return uVar1 == 0x1141 || uVar1 == 0x20;
  }
  __assert_fail("inst",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x4a5,"bool spvtools::val::ValidationState_t::IsPointerType(uint32_t) const");
}

Assistant:

bool ValidationState_t::IsPointerType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);
  return inst->opcode() == spv::Op::OpTypePointer ||
         inst->opcode() == spv::Op::OpTypeUntypedPointerKHR;
}